

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_service.hpp
# Opt level: O0

int __thiscall
asio::detail::reactive_socket_service<asio::ip::tcp>::bind
          (reactive_socket_service<asio::ip::tcp> *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  uint uVar1;
  data_type *pdVar2;
  sockaddr *__addr_00;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000034;
  undefined4 local_18;
  
  uVar1 = *(uint *)CONCAT44(in_register_00000034,__fd);
  pdVar2 = ip::basic_endpoint<asio::ip::tcp>::data((basic_endpoint<asio::ip::tcp> *)0x7147cd);
  __addr_00 = (sockaddr *)
              ip::basic_endpoint<asio::ip::tcp>::size((basic_endpoint<asio::ip::tcp> *)0x7147dc);
  socket_ops::bind((socket_ops *)(ulong)uVar1,(int)pdVar2,__addr_00,__len);
  local_18 = (int)*(undefined8 *)CONCAT44(in_register_0000000c,__len);
  return local_18;
}

Assistant:

asio::error_code bind(implementation_type& impl,
      const endpoint_type& endpoint, asio::error_code& ec)
  {
    socket_ops::bind(impl.socket_, endpoint.data(), endpoint.size(), ec);

    ASIO_ERROR_LOCATION(ec);
    return ec;
  }